

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token slang::parsing::Lexer::concatenateTokens
                (BumpAllocator *alloc,SourceManager *sourceManager,Token left,Token right)

{
  pointer __child_stack;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar1;
  bool bVar2;
  int iVar3;
  LexerOptions *options;
  size_type sVar4;
  EVP_PKEY_CTX *pEVar5;
  EVP_PKEY_CTX *pEVar6;
  undefined4 extraout_var;
  Info *extraout_RDX;
  Lexer *in_RSI;
  Diagnostics *in_RDI;
  Token TVar7;
  string_view sVar8;
  Token token;
  Lexer lexer;
  Diagnostics unused;
  string_view combined;
  char *mem;
  size_t newLength;
  string_view rightText;
  string_view leftText;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  SourceLocation location;
  Token *in_stack_fffffffffffff9e0;
  Lexer *this;
  size_t in_stack_fffffffffffff9e8;
  Token *in_stack_fffffffffffff9f0;
  BumpAllocator *in_stack_fffffffffffff9f8;
  Token *in_stack_fffffffffffffa00;
  BumpAllocator *in_stack_fffffffffffffa28;
  char *in_stack_fffffffffffffa30;
  Lexer *in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  char *in_stack_fffffffffffffa48;
  undefined8 in_stack_fffffffffffffa50;
  BufferID bufferId;
  Diagnostics *diagnostics;
  TokenKind local_520;
  string_view local_508;
  Token local_4f8 [4];
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined1 local_4b0;
  size_t local_4a8;
  char *pcStack_4a0;
  uint32_t local_47c;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  EVP_PKEY_CTX *local_88;
  size_type local_80;
  string_view local_78;
  string_view local_68;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_58;
  SourceLocation local_48;
  Lexer *local_40;
  Diagnostics *local_38;
  Token local_20;
  undefined8 local_10;
  Info *local_8;
  
  bufferId.id = (uint32_t)((ulong)in_stack_fffffffffffffa50 >> 0x20);
  local_40 = in_RSI;
  local_38 = in_RDI;
  local_48 = Token::location(&local_20);
  local_58 = Token::trivia(in_stack_fffffffffffffa00);
  local_68 = Token::rawText(in_stack_fffffffffffff9f0);
  local_78 = Token::rawText(in_stack_fffffffffffff9f0);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_68);
  if (!bVar2) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_78);
    if (!bVar2) {
      options = (LexerOptions *)
                std::basic_string_view<char,_std::char_traits<char>_>::length(&local_68);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_78);
      local_80 = (long)&(options->commentHandlers).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                        .arrays.groups_size_index + sVar4 + 1;
      pEVar5 = (EVP_PKEY_CTX *)
               BumpAllocator::allocate
                         (in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0,
                          in_stack_fffffffffffff9e8);
      local_88 = pEVar5;
      pEVar6 = (EVP_PKEY_CTX *)
               std::basic_string_view<char,_std::char_traits<char>_>::length(&local_68);
      std::basic_string_view<char,_std::char_traits<char>_>::copy(&local_68,pEVar5,pEVar6);
      pEVar5 = local_88;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_68);
      pEVar6 = (EVP_PKEY_CTX *)
               std::basic_string_view<char,_std::char_traits<char>_>::length(&local_78);
      std::basic_string_view<char,_std::char_traits<char>_>::copy(&local_78,pEVar5 + sVar4,pEVar6);
      local_88[local_80 - 1] = (EVP_PKEY_CTX)0x0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_98,(char *)local_88,local_80);
      Diagnostics::Diagnostics((Diagnostics *)0x8620d5);
      local_47c = (uint32_t)BufferID::getPlaceholder();
      local_4a8 = local_98._M_len;
      pcStack_4a0 = local_98._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::data(&local_98);
      diagnostics = local_38;
      this = local_40;
      boost::unordered::
      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
      ::unordered_flat_map
                ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  *)in_stack_fffffffffffffa00);
      local_4b8 = 0x10;
      local_4b4 = 0;
      local_4b0 = 0;
      sVar8._M_len._7_1_ = in_stack_fffffffffffffa47;
      sVar8._M_len._0_7_ = in_stack_fffffffffffffa40;
      sVar8._M_str = in_stack_fffffffffffffa48;
      Lexer(in_stack_fffffffffffffa38,bufferId,sVar8,in_stack_fffffffffffffa30,
            in_stack_fffffffffffffa28,diagnostics,(SourceManager *)this,options);
      LexerOptions::~LexerOptions((LexerOptions *)0x8621cc);
      local_4f8[0] = lex(this);
      bVar2 = true;
      if (local_4f8[0].kind != Unknown) {
        local_508 = Token::rawText(in_stack_fffffffffffff9f0);
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_508);
      }
      if (bVar2 == false) {
        TVar7 = lex(this);
        sVar1 = local_58;
        local_520 = TVar7.kind;
        if (local_520 == EndOfFile) {
          __child_stack = local_58._M_ptr;
          sVar8 = Token::rawText(in_stack_fffffffffffff9f0);
          iVar3 = Token::clone(local_4f8,(__fn *)local_38,__child_stack,
                               (int)sVar1._M_extent._M_extent_value,(void *)sVar8._M_len,
                               sVar8._M_str,local_48);
          local_10 = CONCAT44(extraout_var,iVar3);
          local_8 = extraout_RDX;
        }
        else {
          Token::Token((Token *)this);
        }
      }
      else {
        Token::Token((Token *)this);
      }
      ~Lexer(this);
      Diagnostics::~Diagnostics((Diagnostics *)0x86242d);
      goto LAB_0086243e;
    }
  }
  Token::Token(in_stack_fffffffffffff9e0);
LAB_0086243e:
  TVar7.info = local_8;
  TVar7.kind = (undefined2)local_10;
  TVar7._2_1_ = local_10._2_1_;
  TVar7.numFlags.raw = local_10._3_1_;
  TVar7.rawLen = local_10._4_4_;
  return TVar7;
}

Assistant:

Token Lexer::concatenateTokens(BumpAllocator& alloc, SourceManager& sourceManager, Token left,
                               Token right) {
    auto location = left.location();
    auto trivia = left.trivia();

    // if either side is empty, we have an error; the user tried to concatenate some weird kind of
    // token
    auto leftText = left.rawText();
    auto rightText = right.rawText();
    if (leftText.empty() || rightText.empty())
        return Token();

    // combine the text for both sides; make sure to include room for a null
    size_t newLength = leftText.length() + rightText.length() + 1;
    char* mem = (char*)alloc.allocate(newLength, 1);
    leftText.copy(mem, leftText.length());
    rightText.copy(mem + leftText.length(), rightText.length());
    mem[newLength - 1] = '\0';
    std::string_view combined{mem, newLength};

    Diagnostics unused;
    Lexer lexer{BufferID::getPlaceholder(),
                combined,
                combined.data(),
                alloc,
                unused,
                sourceManager,
                LexerOptions{}};

    auto token = lexer.lex();
    if (token.kind == TokenKind::Unknown || token.rawText().empty())
        return Token();

    // make sure the next token is an EoF, otherwise the tokens were unable to
    // be combined and should be left alone
    if (lexer.lex().kind != TokenKind::EndOfFile)
        return Token();

    return token.clone(alloc, trivia, token.rawText(), location);
}